

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void COVER_ctx_destroy(COVER_ctx_t *ctx)

{
  if (ctx != (COVER_ctx_t *)0x0) {
    if (ctx->suffix != (U32 *)0x0) {
      free(ctx->suffix);
      ctx->suffix = (U32 *)0x0;
    }
    if (ctx->freqs != (U32 *)0x0) {
      free(ctx->freqs);
      ctx->freqs = (U32 *)0x0;
    }
    if (ctx->dmerAt != (U32 *)0x0) {
      free(ctx->dmerAt);
      ctx->dmerAt = (U32 *)0x0;
    }
    if (ctx->offsets != (size_t *)0x0) {
      free(ctx->offsets);
      ctx->offsets = (size_t *)0x0;
    }
  }
  return;
}

Assistant:

static void COVER_ctx_destroy(COVER_ctx_t *ctx) {
  if (!ctx) {
    return;
  }
  if (ctx->suffix) {
    free(ctx->suffix);
    ctx->suffix = NULL;
  }
  if (ctx->freqs) {
    free(ctx->freqs);
    ctx->freqs = NULL;
  }
  if (ctx->dmerAt) {
    free(ctx->dmerAt);
    ctx->dmerAt = NULL;
  }
  if (ctx->offsets) {
    free(ctx->offsets);
    ctx->offsets = NULL;
  }
}